

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

bool __thiscall
args::ValueReader<int>::operator()
          (ValueReader<int> *this,string *name,string *value,int *destination)

{
  ostream *poVar1;
  runtime_error *this_00;
  istringstream ss;
  ostringstream problem;
  string local_340 [32];
  istringstream local_320 [16];
  long local_310;
  long local_300;
  long local_2f8;
  ios_base local_2a8 [264];
  ostringstream local_1a0 [376];
  
  std::__cxx11::istringstream::istringstream(local_320,(string *)value,_S_in);
  std::istream::operator>>((istream *)local_320,destination);
  local_2f8 = local_2f8 - local_300;
  if (local_2f8 == 0) {
    local_2f8 = (**(code **)(local_310 + 0x38))();
  }
  if (local_2f8 < 1) {
    std::__cxx11::istringstream::~istringstream(local_320);
    std::ios_base::~ios_base(local_2a8);
    return true;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Argument \'",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\' received invalid value type \'",0x1f);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(value->_M_dataplus)._M_p,value->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_340);
  *(undefined ***)this_00 = &PTR__runtime_error_0013d8f8;
  __cxa_throw(this_00,&ParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool operator ()(const std::string &name, const std::string &value, T &destination)
        {
            std::istringstream ss(value);
            ss >> destination;

            if (ss.rdbuf()->in_avail() > 0)
            {
#ifdef ARGS_NOEXCEPT
                return false;
#else
                std::ostringstream problem;
                problem << "Argument '" << name << "' received invalid value type '" << value << "'";
                throw ParseError(problem.str());
#endif
            }
            return true;
        }